

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.cpp
# Opt level: O2

void __thiscall
yactfr::internal::DsPktProc::addErProc
          (DsPktProc *this,
          unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
          *erProc)

{
  pointer puVar1;
  __uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_> *this_00
  ;
  TypeId id;
  ulong local_10;
  
  local_10 = ((erProc->_M_t).
              super___uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
              ._M_t.
              super__Tuple_impl<0UL,_yactfr::internal::ErProc_*,_std::default_delete<yactfr::internal::ErProc>_>
              .super__Head_base<0UL,_yactfr::internal::ErProc_*,_false>._M_head_impl)->_ert->_id;
  puVar1 = (this->_erProcsVec).
           super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_10 <
      (ulong)((long)(this->_erProcsVec).
                    super__Vector_base<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>,_std::allocator<std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    std::__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
    operator=((__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
               *)(puVar1 + local_10),
              (__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
               *)erProc);
    return;
  }
  this_00 = (__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
             *)std::__detail::
               _Map_base<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>,_std::allocator<std::pair<const_unsigned_long_long,_std::unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long_long>,_std::hash<unsigned_long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_erProcsMap,&local_10);
  std::__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>::
  operator=(this_00,(__uniq_ptr_impl<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                     *)erProc);
  return;
}

Assistant:

void DsPktProc::addErProc(std::unique_ptr<ErProc> erProc)
{
    const auto id = erProc->ert().id();

    if (id < _erProcsVec.size()) {
        _erProcsVec[id] = std::move(erProc);
    } else {
        _erProcsMap[id] = std::move(erProc);
    }
}